

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_row_mt_mem_dealloc(AV1_COMP *cpi)

{
  uint uVar1;
  uint uVar2;
  TileDataEnc *pTVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar1 = (cpi->mt_info).enc_row_mt.allocated_tile_cols;
  uVar2 = (cpi->mt_info).enc_row_mt.allocated_tile_rows;
  uVar9 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar9;
  }
  lVar8 = 0x5cd8;
  for (; lVar6 = lVar8, uVar7 = uVar5, uVar9 != uVar4; uVar9 = uVar9 + 1) {
    while (uVar7 != 0) {
      pTVar3 = cpi->tile_data;
      av1_row_mt_sync_mem_dealloc
                ((AV1EncRowMultiThreadSync *)
                 ((long)((pTVar3->tctx).txb_skip_cdf + -1) + 0x2e + lVar6));
      if ((cpi->oxcf).algo_cfg.cdf_update_mode != '\0') {
        aom_free(*(void **)((long)pTVar3 + lVar6 + -0x9b8));
        *(undefined8 *)((long)pTVar3 + lVar6 + -0x9b8) = 0;
      }
      lVar6 = lVar6 + 0x5d10;
      uVar7 = uVar7 - 1;
    }
    lVar8 = lVar8 + (long)(int)uVar1 * 0x5d10;
  }
  aom_free((cpi->mt_info).enc_row_mt.num_tile_cols_done);
  (cpi->mt_info).enc_row_mt.num_tile_cols_done = (int *)0x0;
  (cpi->mt_info).enc_row_mt.allocated_rows = 0;
  (cpi->mt_info).enc_row_mt.allocated_cols = 0;
  (cpi->mt_info).enc_row_mt.allocated_sb_rows = 0;
  return;
}

Assistant:

void av1_row_mt_mem_dealloc(AV1_COMP *cpi) {
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = enc_row_mt->allocated_tile_cols;
  const int tile_rows = enc_row_mt->allocated_tile_rows;
  int tile_col, tile_row;

  // Free row based multi-threading sync memory
  for (tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];

      av1_row_mt_sync_mem_dealloc(&this_tile->row_mt_sync);

      if (cpi->oxcf.algo_cfg.cdf_update_mode) {
        aom_free(this_tile->row_ctx);
        this_tile->row_ctx = NULL;
      }
    }
  }
  aom_free(enc_row_mt->num_tile_cols_done);
  enc_row_mt->num_tile_cols_done = NULL;
  enc_row_mt->allocated_rows = 0;
  enc_row_mt->allocated_cols = 0;
  enc_row_mt->allocated_sb_rows = 0;
}